

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_24939c::Db::parseClassEnumType(Db *this)

{
  bool bVar1;
  Db *local_90;
  Node *Name;
  char *local_80;
  StringView local_78;
  StringView local_68;
  StringView local_58;
  StringView local_48;
  StringView local_38;
  undefined1 local_28 [8];
  StringView ElabSpef;
  Db *this_local;
  
  ElabSpef.Last = (char *)this;
  StringView::StringView((StringView *)local_28);
  StringView::StringView(&local_38,"Ts");
  bVar1 = consumeIf(this,local_38);
  if (bVar1) {
    StringView::StringView(&local_48,"struct");
    local_28 = (undefined1  [8])local_48.First;
    ElabSpef.First = local_48.Last;
  }
  else {
    StringView::StringView(&local_58,"Tu");
    bVar1 = consumeIf(this,local_58);
    if (bVar1) {
      StringView::StringView(&local_68,"union");
      local_28 = (undefined1  [8])local_68.First;
      ElabSpef.First = local_68.Last;
    }
    else {
      StringView::StringView(&local_78,"Te");
      bVar1 = consumeIf(this,local_78);
      if (bVar1) {
        StringView::StringView((StringView *)&Name,"enum");
        local_28 = (undefined1  [8])Name;
        ElabSpef.First = local_80;
      }
    }
  }
  local_90 = (Db *)parseName(this,(NameState *)0x0);
  if (local_90 == (Db *)0x0) {
    this_local = (Db *)0x0;
  }
  else {
    bVar1 = StringView::empty((StringView *)local_28);
    if (bVar1) {
      this_local = local_90;
    }
    else {
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::ElaboratedTypeSpefType,StringView&,(anonymous_namespace)::Node*&>
                                   ((Db *)this,(StringView *)local_28,(Node **)&local_90);
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseClassEnumType() {
  StringView ElabSpef;
  if (consumeIf("Ts"))
    ElabSpef = "struct";
  else if (consumeIf("Tu"))
    ElabSpef = "union";
  else if (consumeIf("Te"))
    ElabSpef = "enum";

  Node *Name = parseName();
  if (Name == nullptr)
    return nullptr;

  if (!ElabSpef.empty())
    return make<ElaboratedTypeSpefType>(ElabSpef, Name);

  return Name;
}